

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cc
# Opt level: O0

void __thiscall xemmai::t_engine::f_collector(t_engine *this)

{
  long lVar1;
  t_internal *this_00;
  t_object *ptVar2;
  mutex_type *pmVar3;
  t_handle *this_01;
  t_object *ptVar4;
  bool bVar5;
  lock_guard<std::mutex> this_02;
  t_internal *ptVar6;
  t_handle **pptVar7;
  size_t sVar8;
  long *in_FS_OFFSET;
  anon_class_16_2_20c11228_for___vfn __vfn;
  t_object *local_160;
  t_object *local_130;
  t_object *q_6;
  t_object *cycle_1;
  t_object *p_6;
  t_object *p_5;
  t_object *q_5;
  t_object *p_4;
  size_t live;
  t_object *roots;
  t_handle *q_4;
  t_handle **p_3;
  t_object *p_2;
  t_object *q_3;
  t_object *q_2;
  t_object *q_1;
  t_object *p_1;
  t_object *ptStack_a8;
  bool failed;
  t_object *cycle;
  lock_guard<std::mutex> lock_1;
  t_object *garbage;
  t_internal *q;
  t_internal **p;
  lock_guard<std::mutex> lock;
  t_engine *this_local;
  memory_order __b_1;
  memory_order __b;
  __atomic_flag_data_type __v;
  
  *(t_engine **)(*in_FS_OFFSET + -0x60) = this;
  lock._M_device = (mutex_type *)this;
  if (((this->v_options).v_verbose & 1U) != 0) {
    fprintf(_stderr,"collector starting...\n");
  }
  lVar1 = *in_FS_OFFSET;
  *(long *)(*in_FS_OFFSET + -0x18) = lVar1 + -0x20;
  *(long *)(*in_FS_OFFSET + -0x20) = lVar1 + -0x20;
  do {
    std::operator&(relaxed,__memory_order_mask);
    (this->v_collector__running).super___atomic_flag_base._M_i = false;
    std::__atomic_notify_address<bool>((bool *)this,true);
    __vfn.this = &this->v_collector__running;
    __vfn._0_8_ = 2;
    std::
    __atomic_wait_address_v<bool,std::atomic_flag::wait(bool,std::memory_order)const::_lambda()_1_>
              ((bool *)this,false,__vfn);
    if ((this->v_collector__quitting & 1U) != 0) {
      if (((this->v_options).v_verbose & 1U) != 0) {
        fprintf(_stderr,"collector quitting...\n");
      }
      std::operator&(relaxed,__memory_order_mask);
      (this->v_collector__running).super___atomic_flag_base._M_i = false;
      std::__atomic_notify_address<bool>((bool *)this,false);
      return;
    }
    this->v_collector__epoch = this->v_collector__epoch + 1;
    std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&p,&this->v_thread__mutex);
    ptVar6 = (t_internal *)&this->v_thread__internals;
    while (q = ptVar6, q->v_next != (t_internal *)0x0) {
      this_00 = q->v_next;
      if (-1 < this_00->v_done) {
        t_thread::t_internal::f_epoch(this_00);
      }
      ptVar6 = this_00;
      if ((2 < this_00->v_done) &&
         (q->v_next = this_00->v_next, ptVar6 = q, this_00 != (t_internal *)0x0)) {
        operator_delete(this_00,0xca0);
      }
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&p);
    lock_1._M_device = (mutex_type *)0x0;
    while (this->v_cycles != (t_object *)0x0) {
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)&cycle,&this->v_object__reviving__mutex);
      ptStack_a8 = this->v_cycles;
      this->v_cycles = ptStack_a8->v_next_cycle;
      bVar5 = false;
      q_1 = ptStack_a8;
      do {
        while (ptVar2 = q_1->v_next, ptVar2->v_type == (t_type *)0x0) {
          q_1->v_next = ptVar2->v_next;
          f_free_as_collect(this,ptVar2);
          if (ptVar2 == ptStack_a8) {
            if (q_1 == ptVar2) {
              local_160 = (t_object *)0x0;
            }
            else {
              local_160 = q_1;
            }
            ptStack_a8 = local_160;
            goto LAB_00285ac6;
          }
        }
        if (((ptVar2->v_color != c_color__ORANGE) || (ptVar2->v_cyclic != 0)) ||
           ((ptVar2->v_reviving & 1U) != 0)) {
          bVar5 = true;
        }
        ptVar2->v_reviving = false;
        q_1 = ptVar2;
      } while (ptVar2 != ptStack_a8);
LAB_00285ac6:
      if (ptStack_a8 != (t_object *)0x0) {
        if (bVar5) {
          q_1 = ptStack_a8;
          if (ptStack_a8->v_color == c_color__ORANGE) {
            ptStack_a8->v_color = c_color__PURPLE;
          }
          do {
            ptVar2 = q_1->v_next;
            if (q_1->v_count == 0) {
              q_1->v_next = (t_object *)lock_1._M_device;
              lock_1._M_device = (mutex_type *)q_1;
            }
            else if (q_1->v_color == c_color__PURPLE) {
              t_object::f_append(q_1);
            }
            else {
              q_1->v_color = c_color__BLACK;
              q_1->v_next = (t_object *)0x0;
            }
            q_1 = ptVar2;
          } while (ptVar2 != ptStack_a8);
        }
        else {
          do {
            q_1->v_color = c_color__RED;
            q_1 = q_1->v_next;
          } while (q_1 != ptStack_a8);
          do {
            t_object::f_cyclic_decrement(q_1);
            q_1 = q_1->v_next;
          } while (q_1 != ptStack_a8);
          do {
            ptVar2 = q_1->v_next;
            f_free_as_collect(this,q_1);
            q_1 = ptVar2;
          } while (ptVar2 != ptStack_a8);
        }
      }
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&cycle);
    }
    while (this_02._M_device = lock_1._M_device, lock_1._M_device != (mutex_type *)0x0) {
      pmVar3 = (mutex_type *)((lock_1._M_device)->super___mutex_base)._M_mutex.__align;
      ((lock_1._M_device)->super___mutex_base)._M_mutex.__align = 0;
      lock_1._M_device = pmVar3;
      t_object::f_loop<&xemmai::t_object::f_decrement_step>((t_object *)this_02._M_device);
    }
    pptVar7 = &this->v_library__handle__finalizing;
    while (*pptVar7 != (t_handle *)0x0) {
      this_01 = *pptVar7;
      *pptVar7 = this_01->v_next;
      if (this_01 != (t_handle *)0x0) {
        t_library::t_handle::~t_handle(this_01);
        operator_delete(this_01,0x10);
      }
    }
    lVar1 = *in_FS_OFFSET;
    ptVar2 = (t_object *)(lVar1 + -0x20);
    if (ptVar2->v_next != ptVar2) {
      sVar8 = t_heap<xemmai::t_object>::f_live(&this->v_object__heap);
      if (sVar8 < this->v_object__lower) {
        this->v_object__lower = sVar8;
      }
      if ((this->v_options).v_collector__threshold <= sVar8 - this->v_object__lower) {
        this->v_object__lower = sVar8;
        this->v_collector__collect = this->v_collector__collect + 1;
        p_5 = ptVar2->v_next;
        q_5 = ptVar2;
        do {
          if (p_5->v_count == 0) {
            __assert_fail("q->v_count > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/shin1m[P]xemmai/src/engine.cc"
                          ,0x69,"void xemmai::t_engine::f_collector()");
          }
          if (p_5->v_color == c_color__PURPLE) {
            t_object::f_mark_gray(p_5);
            q_5 = p_5;
          }
          else {
            q_5->v_next = p_5->v_next;
            p_5->v_next = (t_object *)0x0;
          }
          p_5 = q_5->v_next;
        } while (p_5 != ptVar2);
        if (ptVar2->v_next != ptVar2) {
          p_6 = ptVar2->v_next;
          do {
            t_object::f_scan_gray(p_6);
            p_6 = p_6->v_next;
          } while (p_6 != ptVar2);
          do {
            ptVar4 = ptVar2->v_next;
            ptVar2->v_next = ptVar4->v_next;
            if (ptVar4->v_color == c_color__WHITE) {
              t_object::f_collect_white(ptVar4);
              ptVar4 = *(t_object **)(*in_FS_OFFSET + -8);
              local_130 = ptVar4;
              do {
                t_object::f_step<&xemmai::t_object::f_scan_red>(local_130);
                local_130 = local_130->v_next;
              } while (local_130 != ptVar4);
              do {
                local_130->v_color = c_color__ORANGE;
                local_130 = local_130->v_next;
              } while (local_130 != ptVar4);
              ptVar4->v_next_cycle = this->v_cycles;
              this->v_cycles = ptVar4;
            }
            else {
              ptVar4->v_next = (t_object *)0x0;
            }
          } while (ptVar2->v_next != ptVar2);
        }
        *(t_object **)(lVar1 + -0x18) = ptVar2;
      }
    }
    t_heap<xemmai::t_object>::f_flush(&this->v_object__heap);
  } while( true );
}

Assistant:

void t_engine::f_collector()
{
	v_instance = this;
	if (v_options.v_verbose) std::fprintf(stderr, "collector starting...\n");
	t_object::v_roots.v_next = t_object::v_roots.v_previous = reinterpret_cast<t_object*>(&t_object::v_roots);
	while (true) {
		v_collector__running.clear(std::memory_order_relaxed);
		v_collector__running.notify_all();
		v_collector__running.wait(false, std::memory_order_acquire);
		if (v_collector__quitting) break;
		++v_collector__epoch;
		{
			std::lock_guard lock(v_thread__mutex);
			for (auto p = &v_thread__internals; *p;) {
				auto q = *p;
				if (q->v_done >= 0) q->f_epoch();
				if (q->v_done < 3) {
					p = &q->v_next;
				} else {
					*p = q->v_next;
					delete q;
				}
			}
		}
		t_object* garbage = nullptr;
		while (v_cycles) {
			std::lock_guard lock(v_object__reviving__mutex);
			auto cycle = v_cycles;
			v_cycles = cycle->v_next_cycle;
			auto failed = false;
			auto p = cycle;
			while (true) {
				auto q = p->v_next;
				if (q->v_type) {
					if (q->v_color != c_color__ORANGE || q->v_cyclic > 0 || q->v_reviving) failed = true;
					q->v_reviving = false;
					p = q;
					if (p == cycle) break;
				} else {
					p->v_next = q->v_next;
					f_free_as_collect(q);
					if (q == cycle) {
						cycle = p == q ? nullptr : p;
						break;
					}
				}
			}
			if (!cycle) continue;
			if (failed) {
				p = cycle;
				if (p->v_color == c_color__ORANGE) p->v_color = c_color__PURPLE;
				do {
					auto q = p->v_next;
					if (p->v_count <= 0) {
						p->v_next = garbage;
						garbage = p;
					} else if (p->v_color == c_color__PURPLE) {
						t_object::f_append(p);
					} else {
						p->v_color = c_color__BLACK;
						p->v_next = nullptr;
					}
					p = q;
				} while (p != cycle);
			} else {
				do p->v_color = c_color__RED; while ((p = p->v_next) != cycle);
				do p->f_cyclic_decrement(); while ((p = p->v_next) != cycle);
				do {
					auto q = p->v_next;
					f_free_as_collect(p);
					p = q;
				} while (p != cycle);
			}
		}
		while (garbage) {
			auto p = garbage;
			garbage = p->v_next;
			p->v_next = nullptr;
			p->f_loop<&t_object::f_decrement_step>();
		}
		for (auto& p = v_library__handle__finalizing; p;) {
			auto q = p;
			p = q->v_next;
			delete q;
		}
		auto roots = reinterpret_cast<t_object*>(&t_object::v_roots);
		if (roots->v_next != roots) {
			auto live = v_object__heap.f_live();
			if (live < v_object__lower) v_object__lower = live;
			if (live - v_object__lower >= v_options.v_collector__threshold) {
				v_object__lower = live;
				++v_collector__collect;
				{
					auto p = roots;
					auto q = p->v_next;
					do {
						assert(q->v_count > 0);
						if (q->v_color == c_color__PURPLE) {
							q->f_mark_gray();
							p = q;
						} else {
							p->v_next = q->v_next;
							q->v_next = nullptr;
						}
						q = p->v_next;
					} while (q != roots);
				}
				if (roots->v_next != roots) {
					{
						auto p = roots->v_next;
						do p->f_scan_gray(); while ((p = p->v_next) != roots);
					}
					do {
						auto p = roots->v_next;
						roots->v_next = p->v_next;
						if (p->v_color == c_color__WHITE) {
							p->f_collect_white();
							auto cycle = t_object::v_cycle;
							auto q = cycle;
							do q->f_step<&t_object::f_scan_red>(); while ((q = q->v_next) != cycle);
							do q->v_color = c_color__ORANGE; while ((q = q->v_next) != cycle);
							cycle->v_next_cycle = v_cycles;
							v_cycles = cycle;
						} else {
							p->v_next = nullptr;
						}
					} while (roots->v_next != roots);
				}
				roots->v_previous = roots;
			}
		}
		v_object__heap.f_flush();
	}
	if (v_options.v_verbose) std::fprintf(stderr, "collector quitting...\n");
	v_collector__running.clear(std::memory_order_relaxed);
	v_collector__running.notify_one();
}